

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_secp256k1_pippenger_bucket_window_inv(void)

{
  int iVar1;
  size_t sVar2;
  int i;
  int local_4;
  
  sVar2 = secp256k1_pippenger_bucket_window_inv(0);
  if (sVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x13c6,"test condition failed: secp256k1_pippenger_bucket_window_inv(0) == 0");
    abort();
  }
  local_4 = 1;
  do {
    if (0xc < local_4) {
      return;
    }
    if (local_4 != 8) {
      sVar2 = secp256k1_pippenger_bucket_window_inv(local_4);
      iVar1 = secp256k1_pippenger_bucket_window(sVar2);
      if (iVar1 != local_4) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
                ,0x13cc,
                "test condition failed: secp256k1_pippenger_bucket_window(secp256k1_pippenger_bucket_window_inv(i)) == i"
               );
        abort();
      }
      if (local_4 != 0xc) {
        sVar2 = secp256k1_pippenger_bucket_window_inv(local_4);
        iVar1 = secp256k1_pippenger_bucket_window(sVar2 + 1);
        if (iVar1 <= local_4) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
                  ,0x13ce,
                  "test condition failed: secp256k1_pippenger_bucket_window(secp256k1_pippenger_bucket_window_inv(i)+1) > i"
                 );
          abort();
        }
      }
    }
    local_4 = local_4 + 1;
  } while( true );
}

Assistant:

static void test_secp256k1_pippenger_bucket_window_inv(void) {
    int i;

    CHECK(secp256k1_pippenger_bucket_window_inv(0) == 0);
    for(i = 1; i <= PIPPENGER_MAX_BUCKET_WINDOW; i++) {
        /* Bucket_window of 8 is not used with endo */
        if (i == 8) {
            continue;
        }
        CHECK(secp256k1_pippenger_bucket_window(secp256k1_pippenger_bucket_window_inv(i)) == i);
        if (i != PIPPENGER_MAX_BUCKET_WINDOW) {
            CHECK(secp256k1_pippenger_bucket_window(secp256k1_pippenger_bucket_window_inv(i)+1) > i);
        }
    }
}